

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O0

void __thiscall ProcessesView::addItem(ProcessesView *this,int row,int column,QVariant *data)

{
  int iVar1;
  QStandardItem *pQVar2;
  Alignment local_38 [4];
  QStandardItem *local_28;
  QStandardItem *qItem;
  QVariant *data_local;
  int column_local;
  int row_local;
  ProcessesView *this_local;
  
  qItem = (QStandardItem *)data;
  data_local._0_4_ = column;
  data_local._4_4_ = row;
  _column_local = this;
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QStandardItem::QStandardItem(pQVar2);
  local_28 = pQVar2;
  (**(code **)(*(long *)pQVar2 + 0x20))(pQVar2,qItem,0);
  pQVar2 = local_28;
  QFlags<Qt::AlignmentFlag>::QFlags(local_38,AlignHCenter);
  QStandardItem::setTextAlignment(pQVar2,local_38[0]);
  iVar1 = QAbstractItemView::model();
  QStandardItemModel::setItem(iVar1,data_local._4_4_,(QStandardItem *)(ulong)(uint)data_local);
  return;
}

Assistant:

void ProcessesView::addItem(int row, int column, const QVariant &data) {
    auto *qItem = new QStandardItem();
    qItem->setData(data, Qt::DisplayRole);
    qItem->setTextAlignment(Qt::AlignHCenter);
    ((QStandardItemModel*)model())->setItem(row, column, qItem);
}